

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::generate_isset_check_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_field *field)

{
  t_dart_generator *this_00;
  t_dart_generator *this_01;
  string field_name;
  string sStack_78;
  
  this_00 = (t_dart_generator *)&field->name_;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,(string *)this_00);
  this_01 = (t_dart_generator *)&stack0xffffffffffffffa8;
  get_member_name((string *)this_01,this_00,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string((string *)&sStack_78,(string *)this_01);
  generate_isset_check(__return_storage_ptr__,this_01,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::generate_isset_check(t_field* field) {
  string field_name = get_member_name(field->get_name());
  return generate_isset_check(field_name);
}